

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint _c;
  uint _c_00;
  uint uVar4;
  void *_elemsize;
  uint channels;
  int iVar5;
  void *__arg;
  ulong uVar6;
  int _h;
  Mat m;
  Mat bottom_blob_sliced;
  Mat borderm;
  
  iVar1 = bottom_blob->w;
  iVar2 = this->outw;
  if (iVar2 == -0xea) {
    iVar5 = ~this->woffset + iVar1;
  }
  else {
    iVar5 = iVar1 - this->woffset;
    if ((iVar2 != -0xe9) && (iVar2 <= iVar5)) {
      iVar5 = iVar2;
    }
  }
  iVar2 = bottom_blob->h;
  iVar3 = this->outh;
  if (iVar3 == -0xea) {
    _h = ~this->hoffset + iVar2;
  }
  else {
    _h = iVar2 - this->hoffset;
    if ((iVar3 != -0xe9) && (iVar3 <= _h)) {
      _h = iVar3;
    }
  }
  _c = bottom_blob->c;
  _c_00 = this->coffset;
  uVar4 = this->outc;
  if (uVar4 == 0xffffff16) {
    channels = ~_c_00 + _c;
  }
  else {
    channels = _c - _c_00;
    if ((uVar4 != 0xffffff17) && ((int)uVar4 <= (int)channels)) {
      channels = uVar4;
    }
  }
  iVar3 = bottom_blob->dims;
  _elemsize = (void *)bottom_blob->elemsize;
  if ((iVar2 == _h && iVar1 == iVar5) && (channels == _c)) {
    Mat::operator=(top_blob,bottom_blob);
    return 0;
  }
  __arg = _elemsize;
  Mat::channel_range(&bottom_blob_sliced,bottom_blob,_c_00,channels);
  if (iVar2 == _h && iVar1 == iVar5) {
    Mat::clone(&m,(__fn *)&bottom_blob_sliced,(void *)0x0,channels,__arg);
    Mat::operator=(top_blob,&m);
    Mat::~Mat(&m);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
      iVar5 = -100;
      goto LAB_0012cac9;
    }
  }
  iVar1 = this->woffset;
  iVar2 = this->hoffset;
  if (iVar3 == 3) {
    Mat::create(top_blob,iVar5,_h,_c,(size_t)_elemsize,opt->blob_allocator);
    iVar5 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_0012cac9;
    if ((int)_c < 1) {
      _c = 0;
    }
    for (uVar6 = 0; _c != uVar6; uVar6 = uVar6 + 1) {
      m.data = (void *)(bottom_blob_sliced.cstep * uVar6 * bottom_blob_sliced.elemsize +
                       (long)bottom_blob_sliced.data);
      m.refcount = (int *)0x0;
      m.elemsize = bottom_blob_sliced.elemsize;
      m.packing = bottom_blob_sliced.packing;
      m.allocator = bottom_blob_sliced.allocator;
      m.dims = 2;
      m.w = bottom_blob_sliced.w;
      m.h = bottom_blob_sliced.h;
      m.c = 1;
      m.cstep = (size_t)(bottom_blob_sliced.h * bottom_blob_sliced.w);
      Mat::channel(&borderm,top_blob,(int)uVar6);
      if (_elemsize == (void *)0x4) {
        copy_cut_border_image<float>(&m,&borderm,iVar2,iVar1);
      }
      else if (_elemsize == (void *)0x1) {
        copy_cut_border_image<signed_char>(&m,&borderm,iVar2,iVar1);
      }
      Mat::~Mat(&borderm);
      Mat::~Mat(&m);
    }
  }
  else if (iVar3 == 2) {
    Mat::create(top_blob,_h,_h,(size_t)_elemsize,opt->blob_allocator);
    iVar5 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_0012cac9;
    if (_elemsize == (void *)0x4) {
      copy_cut_border_image<float>(&bottom_blob_sliced,top_blob,iVar2,iVar1);
    }
    else if (_elemsize == (void *)0x1) {
      copy_cut_border_image<signed_char>(&bottom_blob_sliced,top_blob,iVar2,iVar1);
    }
  }
  iVar5 = 0;
LAB_0012cac9:
  Mat::~Mat(&bottom_blob_sliced);
  return iVar5;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _outw;
    int _outh;
    int _outc;

    if (outw == -233)
        _outw = w - woffset;
    else if (outw == -234)
        _outw = w - 1 - woffset;
    else
        _outw = std::min(outw, w - woffset);

    if (outh == -233)
        _outh = h - hoffset;
    else if (outh == -234)
        _outh = h - 1 - hoffset;
    else
        _outh = std::min(outh, h - hoffset);

    if (outc == -233)
        _outc = channels - coffset;
    else if (outc == -234)
        _outc = channels - 1 - coffset;
    else
        _outc = std::min(outc, channels - coffset);

    if (_outw == w && _outh == h && _outc == channels)
    {
        top_blob = bottom_blob;
        return 0;
    }

    const Mat bottom_blob_sliced = bottom_blob.channel_range(coffset, _outc);

    if (_outw == w && _outh == h)
    {
        top_blob = bottom_blob_sliced.clone();
        if (top_blob.empty())
            return -100;
    }

    int top = hoffset;
    int left = woffset;

    if (dims == 2)
    {
        top_blob.create(_outh, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob_sliced, top_blob, top, left);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob_sliced, top_blob, top, left);
    }

    if (dims == 3)
    {
        top_blob.create(_outw, _outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, top, left);
            else if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, top, left);
        }
    }

    return 0;
}